

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zDec.c
# Opt level: O1

Byte ReadByte(void *pp)

{
  Byte *pBVar1;
  Byte BVar2;
  undefined4 uVar3;
  byte *pbVar4;
  size_t size;
  long local_20;
  
  pBVar1 = *(Byte **)((long)pp + 8);
  if (pBVar1 == *(Byte **)((long)pp + 0x10)) {
    if (*(int *)((long)pp + 0x2c) == 0) {
      local_20 = (long)pBVar1 - *(long *)((long)pp + 0x18);
      *(long *)((long)pp + 0x20) = *(long *)((long)pp + 0x20) + local_20;
      uVar3 = (**(code **)(*(long *)((long)pp + 0x30) + 8))();
      *(undefined4 *)((long)pp + 0x2c) = uVar3;
      local_20 = 0x2000000;
      uVar3 = (*(code *)**(undefined8 **)((long)pp + 0x30))
                        (*(undefined8 **)((long)pp + 0x30),(long)pp + 0x18,&local_20);
      *(undefined4 *)((long)pp + 0x2c) = uVar3;
      pbVar4 = *(byte **)((long)pp + 0x18);
      *(byte **)((long)pp + 8) = pbVar4;
      *(byte **)((long)pp + 0x10) = pbVar4 + local_20;
      if (local_20 != 0) {
        *(byte **)((long)pp + 8) = pbVar4 + 1;
        pbVar4 = (byte *)(ulong)*pbVar4;
      }
      if (local_20 != 0) {
        return (Byte)pbVar4;
      }
    }
    *(undefined4 *)((long)pp + 0x28) = 1;
    BVar2 = '\0';
  }
  else {
    *(Byte **)((long)pp + 8) = pBVar1 + 1;
    BVar2 = *pBVar1;
  }
  return BVar2;
}

Assistant:

static Byte ReadByte(void *pp)
{
  CByteInToLook *p = (CByteInToLook *)pp;
  if (p->cur != p->end)
    return *p->cur++;
  if (p->res == SZ_OK)
  {
    size_t size = p->cur - p->begin;
    p->processed += size;
    p->res = p->inStream->Skip(p->inStream, size);
    size = (1 << 25);
    p->res = p->inStream->Look(p->inStream, (const void **)&p->begin, &size);
    p->cur = p->begin;
    p->end = p->begin + size;
    if (size != 0)
      return *p->cur++;;
  }
  p->extra = True;
  return 0;
}